

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O0

boolean encode_mcu_gather(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  int iVar1;
  jpeg_entropy_encoder *pjVar2;
  jpeg_component_info *compptr;
  int ci;
  int blkn;
  huff_entropy_ptr_conflict entropy;
  JBLOCKROW *MCU_data_local;
  j_compress_ptr cinfo_local;
  
  pjVar2 = cinfo->entropy;
  if (cinfo->restart_interval != 0) {
    if (*(int *)&pjVar2[2].encode_mcu == 0) {
      for (compptr._0_4_ = 0; (int)compptr < cinfo->comps_in_scan; compptr._0_4_ = (int)compptr + 1)
      {
        *(undefined4 *)((long)&pjVar2[1].encode_mcu + (long)(int)compptr * 4 + 4) = 0;
      }
      *(uint *)&pjVar2[2].encode_mcu = cinfo->restart_interval;
    }
    *(int *)&pjVar2[2].encode_mcu = *(int *)&pjVar2[2].encode_mcu + -1;
  }
  for (compptr._4_4_ = 0; compptr._4_4_ < cinfo->blocks_in_MCU; compptr._4_4_ = compptr._4_4_ + 1) {
    iVar1 = cinfo->MCU_membership[compptr._4_4_];
    htest_one_block(cinfo,*MCU_data[compptr._4_4_],
                    *(int *)((long)&pjVar2[1].encode_mcu + (long)iVar1 * 4 + 4),
                    (long *)(&pjVar2[5].encode_mcu)[cinfo->cur_comp_info[iVar1]->dc_tbl_no],
                    (long *)(&pjVar2[6].finish_pass)[cinfo->cur_comp_info[iVar1]->ac_tbl_no]);
    *(int *)((long)&pjVar2[1].encode_mcu + (long)iVar1 * 4 + 4) = (int)(*MCU_data[compptr._4_4_])[0]
    ;
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
encode_mcu_gather (j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  huff_entropy_ptr entropy = (huff_entropy_ptr) cinfo->entropy;
  int blkn, ci;
  jpeg_component_info * compptr;

  /* Take care of restart intervals if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      /* Re-initialize DC predictions to 0 */
      for (ci = 0; ci < cinfo->comps_in_scan; ci++)
	entropy->saved.last_dc_val[ci] = 0;
      /* Update restart state */
      entropy->restarts_to_go = cinfo->restart_interval;
    }
    entropy->restarts_to_go--;
  }

  for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
    ci = cinfo->MCU_membership[blkn];
    compptr = cinfo->cur_comp_info[ci];
    htest_one_block(cinfo, MCU_data[blkn][0], entropy->saved.last_dc_val[ci],
		    entropy->dc_count_ptrs[compptr->dc_tbl_no],
		    entropy->ac_count_ptrs[compptr->ac_tbl_no]);
    entropy->saved.last_dc_val[ci] = MCU_data[blkn][0][0];
  }

  return TRUE;
}